

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_debug.cpp
# Opt level: O3

void __thiscall FGLDebug::OutputMessageLog(FGLDebug *this)

{
  GLenum severity;
  GLuint GVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  TArray<int,_int> lengths;
  TArray<char,_char> messageLog;
  TArray<unsigned_int,_unsigned_int> severities;
  TArray<unsigned_int,_unsigned_int> types;
  TArray<unsigned_int,_unsigned_int> ids;
  TArray<unsigned_int,_unsigned_int> sources;
  GLint maxDebugMessageLength;
  
  if (this->mCurrentLevel != 0) {
    maxDebugMessageLength = 0;
    (*_ptrc_glGetIntegerv)(0x9143,&maxDebugMessageLength);
    uVar3 = maxDebugMessageLength * 0x32;
    sources.Array = (uint *)0x0;
    sources.Most = 0;
    sources.Count = 0;
    types.Array = (uint *)0x0;
    types.Most = 0;
    types.Count = 0;
    severities.Array = (uint *)0x0;
    severities.Most = 0;
    severities.Count = 0;
    ids.Array = (uint *)0x0;
    ids.Most = 0;
    ids.Count = 0;
    lengths.Array = (int *)0x0;
    lengths.Most = 0;
    lengths.Count = 0;
    messageLog.Array = (char *)0x0;
    messageLog.Most = 0;
    messageLog.Count = 0;
    TArray<unsigned_int,_unsigned_int>::Grow(&sources,0x32);
    sources.Count = 0x32;
    if (types.Count < 0x32) {
      TArray<unsigned_int,_unsigned_int>::Grow(&types,0x32 - types.Count);
    }
    types.Count = 0x32;
    if (severities.Count < 0x32) {
      TArray<unsigned_int,_unsigned_int>::Grow(&severities,0x32 - severities.Count);
    }
    severities.Count = 0x32;
    if (ids.Count < 0x32) {
      TArray<unsigned_int,_unsigned_int>::Grow(&ids,0x32 - ids.Count);
    }
    ids.Count = 0x32;
    if (lengths.Count < 0x32) {
      TArray<int,_int>::Grow(&lengths,0x32 - lengths.Count);
    }
    lengths.Count = 0x32;
    if (messageLog.Count <= uVar3 && uVar3 - messageLog.Count != 0) {
      TArray<char,_char>::Grow(&messageLog,uVar3 - messageLog.Count);
    }
    messageLog.Count = uVar3;
    while (GVar1 = (*_ptrc_glGetDebugMessageLog)
                             (0x32,uVar3,sources.Array,types.Array,ids.Array,severities.Array,
                              lengths.Array,messageLog.Array), GVar1 != 0) {
      uVar5 = 0;
      iVar4 = 0;
      do {
        severity = severities.Array[uVar5];
        if ((int)severity < 0x9147) {
          if (severity == 0x826b) {
            iVar2 = 4;
          }
          else {
            iVar2 = 0;
            if (severity == 0x9146) {
              iVar2 = 1;
            }
          }
        }
        else if (severity == 0x9147) {
          iVar2 = 2;
        }
        else {
          iVar2 = 0;
          if (severity == 0x9148) {
            iVar2 = 3;
          }
        }
        if (iVar2 <= gl_debug_level.Value) {
          PrintMessage(sources.Array[uVar5],types.Array[uVar5],(GLuint)types.Array,severity,
                       lengths.Array[uVar5],messageLog.Array + iVar4);
        }
        iVar4 = iVar4 + lengths.Array[uVar5];
        uVar5 = uVar5 + 1;
      } while (GVar1 != uVar5);
    }
    TArray<char,_char>::~TArray(&messageLog);
    TArray<int,_int>::~TArray(&lengths);
    TArray<unsigned_int,_unsigned_int>::~TArray(&ids);
    TArray<unsigned_int,_unsigned_int>::~TArray(&severities);
    TArray<unsigned_int,_unsigned_int>::~TArray(&types);
    TArray<unsigned_int,_unsigned_int>::~TArray(&sources);
  }
  return;
}

Assistant:

void FGLDebug::OutputMessageLog()
{
	if (mCurrentLevel <= 0)
		return;

	GLint maxDebugMessageLength = 0;
	glGetIntegerv(GL_MAX_DEBUG_MESSAGE_LENGTH, &maxDebugMessageLength);

	const int maxMessages = 50;
	const int messageLogSize = maxMessages * maxDebugMessageLength;

	TArray<GLenum> sources, types, severities;
	TArray<GLuint> ids;
	TArray<GLsizei> lengths;
	TArray<GLchar> messageLog;

	sources.Resize(maxMessages);
	types.Resize(maxMessages);
	severities.Resize(maxMessages);
	ids.Resize(maxMessages);
	lengths.Resize(maxMessages);
	messageLog.Resize(messageLogSize);

	while (true)
	{
		GLuint numMessages = glGetDebugMessageLog(maxMessages, messageLogSize, &sources[0], &types[0], &ids[0], &severities[0], &lengths[0], &messageLog[0]);
		if (numMessages <= 0) break;

		GLsizei offset = 0;
		for (GLuint i = 0; i < numMessages; i++)
		{
			if (!IsFilteredByDebugLevel(severities[i]))
				PrintMessage(sources[i], types[i], ids[i], severities[i], lengths[i], &messageLog[offset]);
			offset += lengths[i];
		}
	}
}